

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentReader * __thiscall capnp::_::ReaderArena::tryGetSegment(ReaderArena *this,SegmentId id)

{
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *this_00;
  uint key;
  bool bVar1;
  int iVar2;
  Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_> *pMVar3;
  undefined4 extraout_var;
  size_t size;
  Own<capnp::_::SegmentReader> *other;
  Own<capnp::_::SegmentReader> local_d8;
  SegmentReader *local_c8;
  SegmentReader *result;
  word *local_b8;
  ReaderArena *local_b0;
  undefined1 local_a8 [8];
  Own<capnp::_::SegmentReader> segment;
  undefined1 auStack_90 [4];
  SegmentWordCount newSegmentSize;
  ArrayPtr<const_capnp::word> newSegment;
  Maybe<kj::Own<capnp::_::SegmentReader>_&> local_78;
  Own<capnp::_::SegmentReader> *local_70;
  Own<capnp::_::SegmentReader> *segment_1;
  HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *local_58;
  HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *s;
  SegmentMap *segments;
  Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_> lock;
  Id<unsigned_int,_capnp::_::Segment> local_24 [3];
  ReaderArena *this_local;
  undefined8 uStack_10;
  SegmentId id_local;
  
  local_24._4_8_ = this;
  this_local._4_4_ = id.value;
  kj::Id<unsigned_int,_capnp::_::Segment>::Id(local_24,0);
  bVar1 = kj::Id<unsigned_int,_capnp::_::Segment>::operator==
                    ((Id<unsigned_int,_capnp::_::Segment> *)((long)&this_local + 4),local_24);
  if (bVar1) {
    join_0x00000010_0x00000000_ = SegmentReader::getArray(&this->segment0);
    bVar1 = kj::ArrayPtr<const_capnp::word>::operator==
                      ((ArrayPtr<const_capnp::word> *)&lock.ptr,(void *)0x0);
    if (!bVar1) {
      return &this->segment0;
    }
    return (SegmentReader *)0x0;
  }
  kj::MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>::
  lockExclusive((MutexGuarded<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>
                 *)&segments);
  s = (HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *)0x0;
  pMVar3 = kj::Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>::
           operator*((Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>
                      *)&segments);
  local_58 = (HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *)
             kj::_::readMaybe<kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>>(pMVar3);
  if (local_58 != (HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>> *)0x0) {
    local_78 = kj::HashMap<unsigned_int,kj::Own<capnp::_::SegmentReader>>::find<unsigned_int&>
                         (local_58,(uint *)((long)&this_local + 4));
    local_70 = kj::_::readMaybe<kj::Own<capnp::_::SegmentReader>>(&local_78);
    if (local_70 != (Own<capnp::_::SegmentReader> *)0x0) {
      uStack_10 = kj::Own::operator_cast_to_SegmentReader_((Own *)local_70);
      newSegment.size_._4_4_ = 1;
      goto LAB_0084fe55;
    }
    s = (HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_> *)local_58;
  }
  iVar2 = (*this->message->_vptr_MessageReader[2])(this->message,(ulong)this_local._4_4_);
  _auStack_90 = (word *)CONCAT44(extraout_var,iVar2);
  bVar1 = kj::ArrayPtr<const_capnp::word>::operator==
                    ((ArrayPtr<const_capnp::word> *)auStack_90,(void *)0x0);
  if (bVar1) {
    uStack_10 = (SegmentReader *)0x0;
    newSegment.size_._4_4_ = 1;
  }
  else {
    size = kj::ArrayPtr<const_capnp::word>::size((ArrayPtr<const_capnp::word> *)auStack_90);
    segment.ptr._4_4_ = verifySegmentSize(size);
    pMVar3 = kj::Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>::
             operator*((Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>
                        *)&segments);
    bVar1 = kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>::operator==
                      (pMVar3,(void *)0x0);
    if (bVar1) {
      pMVar3 = kj::Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>
               ::operator->((Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>
                             *)&segments);
      s = kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>::emplace<>
                    (pMVar3);
    }
    local_b0 = this;
    local_b8 = kj::ArrayPtr<const_capnp::word>::begin((ArrayPtr<const_capnp::word> *)auStack_90);
    result = (SegmentReader *)&this->readLimiter;
    kj::
    heap<capnp::_::SegmentReader,capnp::_::ReaderArena*,kj::Id<unsigned_int,capnp::_::Segment>&,capnp::word_const*,unsigned_int&,capnp::_::ReadLimiter*>
              ((kj *)local_a8,&local_b0,
               (Id<unsigned_int,_capnp::_::Segment> *)((long)&this_local + 4),&local_b8,
               (uint *)((long)&segment.ptr + 4),(ReadLimiter **)&result);
    local_c8 = kj::Own::operator_cast_to_SegmentReader_((Own *)local_a8);
    key = this_local._4_4_;
    this_00 = s;
    other = kj::mv<kj::Own<capnp::_::SegmentReader>>((Own<capnp::_::SegmentReader> *)local_a8);
    kj::Own<capnp::_::SegmentReader>::Own(&local_d8,other);
    kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>::insert(this_00,key,&local_d8);
    kj::Own<capnp::_::SegmentReader>::~Own(&local_d8);
    uStack_10 = local_c8;
    newSegment.size_._4_4_ = 1;
    kj::Own<capnp::_::SegmentReader>::~Own((Own<capnp::_::SegmentReader> *)local_a8);
  }
LAB_0084fe55:
  kj::Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_>::~Locked
            ((Locked<kj::Maybe<kj::HashMap<unsigned_int,_kj::Own<capnp::_::SegmentReader>_>_>_> *)
             &segments);
  return (SegmentReader *)uStack_10;
}

Assistant:

SegmentReader* ReaderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArray() == nullptr) {
      return nullptr;
    } else {
      return &segment0;
    }
  }

  auto lock = moreSegments.lockExclusive();

  SegmentMap* segments = nullptr;
  KJ_IF_MAYBE(s, *lock) {
    KJ_IF_MAYBE(segment, s->find(id.value)) {
      return *segment;
    }
    segments = s;
  }

  kj::ArrayPtr<const word> newSegment = message->getSegment(id.value);
  if (newSegment == nullptr) {
    return nullptr;
  }

  SegmentWordCount newSegmentSize = verifySegmentSize(newSegment.size());

  if (*lock == nullptr) {
    // OK, the segment exists, so allocate the map.
    segments = &lock->emplace();
  }

  auto segment = kj::heap<SegmentReader>(
      this, id, newSegment.begin(), newSegmentSize, &readLimiter);
  SegmentReader* result = segment;
  segments->insert(id.value, kj::mv(segment));
  return result;
}